

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O0

int ARGBCopyYToAlpha(uint8_t *src_y,int src_stride_y,uint8_t *dst_argb,int dst_stride_argb,int width
                    ,int height)

{
  int iVar1;
  int in_ECX;
  long in_RDX;
  uint in_ESI;
  long in_RDI;
  uint in_R8D;
  int in_R9D;
  _func_void_uint8_t_ptr_uint8_t_ptr_int *ARGBCopyYToAlphaRow;
  int y;
  code *local_38;
  int local_30;
  uint local_28;
  int local_24;
  long local_20;
  uint local_14;
  long local_10;
  int local_4;
  
  local_38 = ARGBCopyYToAlphaRow_C;
  if ((((in_RDI == 0) || (in_RDX == 0)) || ((int)in_R8D < 1)) || (in_R9D == 0)) {
    local_4 = -1;
  }
  else {
    local_14 = in_ESI;
    local_10 = in_RDI;
    if (in_R9D < 0) {
      in_R9D = -in_R9D;
      local_10 = in_RDI + (int)((in_R9D + -1) * in_ESI);
      local_14 = -in_ESI;
    }
    local_28 = in_R8D;
    local_24 = in_ECX;
    if ((local_14 == in_R8D) && (in_ECX == in_R8D << 2)) {
      local_28 = in_R9D * in_R8D;
      in_R9D = 1;
      local_24 = 0;
      local_14 = 0;
    }
    iVar1 = libyuv::TestCpuFlag(in_R9D);
    if ((iVar1 != 0) && (local_38 = ARGBCopyYToAlphaRow_Any_SSE2, (local_28 & 7) == 0)) {
      local_38 = ARGBCopyYToAlphaRow_SSE2;
    }
    iVar1 = libyuv::TestCpuFlag(in_R9D);
    if ((iVar1 != 0) && (local_38 = ARGBCopyYToAlphaRow_Any_AVX2, (local_28 & 0xf) == 0)) {
      local_38 = ARGBCopyYToAlphaRow_AVX2;
    }
    local_20 = in_RDX;
    for (local_30 = 0; local_30 < in_R9D; local_30 = local_30 + 1) {
      (*local_38)(local_10,local_20,local_28);
      local_10 = local_10 + (int)local_14;
      local_20 = local_20 + local_24;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

LIBYUV_API
int ARGBCopyYToAlpha(const uint8_t* src_y,
                     int src_stride_y,
                     uint8_t* dst_argb,
                     int dst_stride_argb,
                     int width,
                     int height) {
  int y;
  void (*ARGBCopyYToAlphaRow)(const uint8_t* src_y, uint8_t* dst_argb,
                              int width) = ARGBCopyYToAlphaRow_C;
  if (!src_y || !dst_argb || width <= 0 || height == 0) {
    return -1;
  }
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    src_y = src_y + (height - 1) * src_stride_y;
    src_stride_y = -src_stride_y;
  }
  // Coalesce rows.
  if (src_stride_y == width && dst_stride_argb == width * 4) {
    width *= height;
    height = 1;
    src_stride_y = dst_stride_argb = 0;
  }
#if defined(HAS_ARGBCOPYYTOALPHAROW_SSE2)
  if (TestCpuFlag(kCpuHasSSE2)) {
    ARGBCopyYToAlphaRow = ARGBCopyYToAlphaRow_Any_SSE2;
    if (IS_ALIGNED(width, 8)) {
      ARGBCopyYToAlphaRow = ARGBCopyYToAlphaRow_SSE2;
    }
  }
#endif
#if defined(HAS_ARGBCOPYYTOALPHAROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    ARGBCopyYToAlphaRow = ARGBCopyYToAlphaRow_Any_AVX2;
    if (IS_ALIGNED(width, 16)) {
      ARGBCopyYToAlphaRow = ARGBCopyYToAlphaRow_AVX2;
    }
  }
#endif
#if defined(HAS_ARGBCOPYYTOALPHAROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    ARGBCopyYToAlphaRow = ARGBCopyYToAlphaRow_Any_MMI;
    if (IS_ALIGNED(width, 8)) {
      ARGBCopyYToAlphaRow = ARGBCopyYToAlphaRow_MMI;
    }
  }
#endif

  for (y = 0; y < height; ++y) {
    ARGBCopyYToAlphaRow(src_y, dst_argb, width);
    src_y += src_stride_y;
    dst_argb += dst_stride_argb;
  }
  return 0;
}